

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Basic.hpp
# Opt level: O2

void ddd::utils::read_vector<char>(vector<char,_std::allocator<char>_> *vec,istream *is)

{
  pointer pcVar1;
  size_t size;
  unsigned_long local_20;
  
  pcVar1 = (vec->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  if ((vec->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
      _M_finish != pcVar1) {
    (vec->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data._M_finish
         = pcVar1;
  }
  local_20 = 0;
  read_value<unsigned_long>(&local_20,is);
  std::vector<char,_std::allocator<char>_>::resize(vec,local_20);
  std::istream::read((char *)is,
                     (long)(vec->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                           super__Vector_impl_data._M_start);
  return;
}

Assistant:

inline void read_vector(std::vector<T>& vec, std::istream& is) {
  vec.clear();
  size_t size = 0;
  read_value(size, is);
  vec.resize(size);
  is.read(reinterpret_cast<char*>(&vec[0]), sizeof(T) * size);
}